

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
embree::avx::
HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
sequential_object_split
          (HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
           *this,ObjectSplit *split,PrimInfoExtRange *set,PrimInfoExtRange *lset,
          PrimInfoExtRange *rset)

{
  undefined1 auVar1 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  PrimRef *pPVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  unsigned_long uVar15;
  unsigned_long uVar16;
  PrimRef *pPVar17;
  PrimRef *pPVar18;
  unsigned_long uVar19;
  uint uVar20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar26;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  pair<unsigned_long,_unsigned_long> pVar34;
  
  uVar4 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uVar5 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  auVar1._0_4_ = split->field_2;
  auVar1._4_4_ = split->data;
  auVar1._8_8_ = (split->mapping).num;
  auVar7 = vpshufd_avx(auVar1,0);
  auVar1 = *(undefined1 (*) [16])(mm_lookupmask_ps + (1L << ((byte)split->dim & 0x3f)) * 0x10);
  pPVar6 = this->prims0;
  pPVar18 = pPVar6 + uVar4;
  pPVar17 = pPVar6 + uVar5;
  aVar21.m128[2] = INFINITY;
  aVar21._0_8_ = 0x7f8000007f800000;
  aVar21.m128[3] = INFINITY;
  aVar22.m128[2] = -INFINITY;
  aVar22._0_8_ = 0xff800000ff800000;
  aVar22.m128[3] = -INFINITY;
  uVar16 = 0;
  uVar15 = 0;
  aVar23 = aVar22;
  aVar24 = aVar21;
  aVar25 = aVar21;
  aVar26 = aVar22;
  aVar27 = aVar21;
  aVar28 = aVar22;
  do {
    pPVar17 = pPVar17 + -1;
    if (pPVar18 <= pPVar17) {
      do {
        aVar2 = (pPVar18->lower).field_0.field_1;
        aVar3 = (pPVar18->upper).field_0.field_1;
        auVar30._0_4_ = aVar2.x + aVar3.x;
        auVar30._4_4_ = aVar2.y + aVar3.y;
        auVar30._8_4_ = aVar2.z + aVar3.z;
        auVar30._12_4_ = aVar2.field_3.w + aVar3.field_3.w;
        auVar29 = vsubps_avx(auVar30,(undefined1  [16])(split->mapping).ofs.field_0);
        auVar32._0_4_ = auVar29._0_4_ * (split->mapping).scale.field_0.v[0];
        auVar32._4_4_ = auVar29._4_4_ * (split->mapping).scale.field_0.v[1];
        auVar32._8_4_ = auVar29._8_4_ * (split->mapping).scale.field_0.v[2];
        auVar32._12_4_ = auVar29._12_4_ * (split->mapping).scale.field_0.v[3];
        auVar29 = vroundps_avx(auVar32,1);
        auVar29 = vcvtps2dq_avx(auVar29);
        auVar29 = vpcmpgtd_avx(auVar7,auVar29);
        auVar29 = auVar1 & auVar29;
        if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar29 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar29[0xf]
           ) break;
        uVar20 = vextractps_avx((undefined1  [16])aVar2,3);
        aVar25.m128 = (__m128)vminps_avx(aVar25.m128,(undefined1  [16])aVar2);
        aVar26.m128 = (__m128)vmaxps_avx(aVar26.m128,(undefined1  [16])aVar3);
        aVar27.m128 = (__m128)vminps_avx(aVar27.m128,auVar30);
        aVar28.m128 = (__m128)vmaxps_avx(aVar28.m128,auVar30);
        uVar15 = uVar15 + (uVar20 >> 0x1b);
        pPVar18 = pPVar18 + 1;
      } while (pPVar18 <= pPVar17);
    }
    if (pPVar17 < pPVar18) {
LAB_002d4cc0:
      uVar19 = (long)pPVar18 - (long)pPVar6 >> 5;
      (lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar25;
      (lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar26;
      (lset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar27;
      (lset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar28;
      (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar4;
      (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar19;
      (lset->super_extended_range<unsigned_long>)._ext_end = uVar19;
      (rset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar24;
      (rset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar23;
      (rset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar21;
      (rset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar22;
      (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar19;
      (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar5;
      (rset->super_extended_range<unsigned_long>)._ext_end = uVar5;
      pVar34.second = uVar16;
      pVar34.first = uVar15;
      return pVar34;
    }
    while( true ) {
      aVar2 = (pPVar17->lower).field_0.field_1;
      aVar3 = (pPVar17->upper).field_0.field_1;
      auVar31._0_4_ = aVar2.x + aVar3.x;
      auVar31._4_4_ = aVar2.y + aVar3.y;
      auVar31._8_4_ = aVar2.z + aVar3.z;
      auVar31._12_4_ = aVar2.field_3.w + aVar3.field_3.w;
      auVar29 = vsubps_avx(auVar31,(undefined1  [16])(split->mapping).ofs.field_0);
      auVar33._0_4_ = auVar29._0_4_ * (split->mapping).scale.field_0.v[0];
      auVar33._4_4_ = auVar29._4_4_ * (split->mapping).scale.field_0.v[1];
      auVar33._8_4_ = auVar29._8_4_ * (split->mapping).scale.field_0.v[2];
      auVar33._12_4_ = auVar29._12_4_ * (split->mapping).scale.field_0.v[3];
      auVar29 = vroundps_avx(auVar33,1);
      auVar29 = vcvtps2dq_avx(auVar29);
      auVar29 = vpcmpgtd_avx(auVar7,auVar29);
      uVar20 = vextractps_avx((undefined1  [16])aVar2,3);
      auVar29 = auVar1 & auVar29;
      if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar29[0xf] < '\0'
         ) break;
      aVar24.m128 = (__m128)vminps_avx(aVar24.m128,(undefined1  [16])aVar2);
      aVar23.m128 = (__m128)vmaxps_avx(aVar23.m128,(undefined1  [16])aVar3);
      aVar21.m128 = (__m128)vminps_avx(aVar21.m128,auVar31);
      aVar22.m128 = (__m128)vmaxps_avx(aVar22.m128,auVar31);
      uVar16 = uVar16 + (uVar20 >> 0x1b);
      pPVar17 = pPVar17 + -1;
      if (pPVar17 < pPVar18) goto LAB_002d4cc0;
    }
    aVar25.m128 = (__m128)vminps_avx(aVar25.m128,(undefined1  [16])aVar2);
    aVar26.m128 = (__m128)vmaxps_avx(aVar26.m128,(undefined1  [16])aVar3);
    aVar27.m128 = (__m128)vminps_avx(aVar27.m128,auVar31);
    aVar28.m128 = (__m128)vmaxps_avx(aVar28.m128,auVar31);
    uVar15 = uVar15 + (uVar20 >> 0x1b);
    aVar2 = (pPVar18->lower).field_0.field_1;
    aVar3 = (pPVar18->upper).field_0.field_1;
    aVar24.m128 = (__m128)vminps_avx(aVar24.m128,(undefined1  [16])aVar2);
    aVar23.m128 = (__m128)vmaxps_avx(aVar23.m128,(undefined1  [16])aVar3);
    auVar29._0_4_ = aVar2.x + aVar3.x;
    auVar29._4_4_ = aVar2.y + aVar3.y;
    auVar29._8_4_ = aVar2.z + aVar3.z;
    auVar29._12_4_ = aVar2.field_3.w + aVar3.field_3.w;
    aVar21.m128 = (__m128)vminps_avx(aVar21.m128,auVar29);
    aVar22.m128 = (__m128)vmaxps_avx(aVar22.m128,auVar29);
    uVar16 = uVar16 + ((uint)(pPVar18->lower).field_0.m128[3] >> 0x1b);
    uVar8 = *(undefined8 *)&(pPVar18->lower).field_0;
    uVar9 = *(undefined8 *)((long)&(pPVar18->lower).field_0 + 8);
    uVar10 = *(undefined8 *)&(pPVar18->upper).field_0;
    uVar11 = *(undefined8 *)((long)&(pPVar18->upper).field_0 + 8);
    uVar12 = *(undefined8 *)((long)&(pPVar17->lower).field_0 + 8);
    uVar13 = *(undefined8 *)&(pPVar17->upper).field_0;
    uVar14 = *(undefined8 *)((long)&(pPVar17->upper).field_0 + 8);
    *(undefined8 *)&(pPVar18->lower).field_0 = *(undefined8 *)&(pPVar17->lower).field_0;
    *(undefined8 *)((long)&(pPVar18->lower).field_0 + 8) = uVar12;
    *(undefined8 *)&(pPVar18->upper).field_0 = uVar13;
    *(undefined8 *)((long)&(pPVar18->upper).field_0 + 8) = uVar14;
    *(undefined8 *)&(pPVar17->lower).field_0 = uVar8;
    *(undefined8 *)((long)&(pPVar17->lower).field_0 + 8) = uVar9;
    *(undefined8 *)&(pPVar17->upper).field_0 = uVar10;
    *(undefined8 *)((long)&(pPVar17->upper).field_0 + 8) = uVar11;
    pPVar18 = pPVar18 + 1;
  } while( true );
}

Assistant:

std::pair<size_t,size_t> sequential_object_split(const ObjectSplit& split, const PrimInfoExtRange& set, PrimInfoExtRange& lset, PrimInfoExtRange& rset) 
        {
          const size_t begin = set.begin();
          const size_t end   = set.end();
          PrimInfo local_left(empty);
          PrimInfo local_right(empty);
          const unsigned int splitPos = split.pos;
          const unsigned int splitDim = split.dim;
          const unsigned int splitDimMask = (unsigned int)1 << splitDim; 

          const typename ObjectBinner::vint vSplitPos(splitPos);
          const typename ObjectBinner::vbool vSplitMask(splitDimMask);
          size_t center = serial_partitioning(prims0,
                                              begin,end,local_left,local_right,
                                              [&] (const PrimRef& ref) { 
                                                return split.mapping.bin_unsafe(ref,vSplitPos,vSplitMask);
                                              },
                                              [] (PrimInfo& pinfo,const PrimRef& ref) { pinfo.add_center2(ref,ref.lower.u >> (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS)); });          
          const size_t left_weight  = local_left.end;
          const size_t right_weight = local_right.end;

          new (&lset) PrimInfoExtRange(begin,center,center,local_left);
          new (&rset) PrimInfoExtRange(center,end,end,local_right);

          assert(!lset.geomBounds.empty() && area(lset.geomBounds) >= 0.0f);
          assert(!rset.geomBounds.empty() && area(rset.geomBounds) >= 0.0f);
          return std::pair<size_t,size_t>(left_weight,right_weight);
        }